

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  uint uVar1;
  int iVar2;
  pointer pSVar3;
  Regexp **ppRVar4;
  pointer pFVar5;
  long lVar6;
  Regexp *pRVar7;
  ostream *poVar8;
  ulong uVar9;
  iterator iter;
  pointer pSVar10;
  int iVar11;
  ulong uVar12;
  int nsuffix;
  long lVar13;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  int nsub_local;
  Regexp **sub_local;
  Regexp *re [2];
  
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nsub_local = nsub;
  sub_local = sub;
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)&stk,&sub_local,&nsub_local);
LAB_001b8198:
  do {
    pFVar5 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar10 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].splices.
              super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar3 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].splices.
             super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar10 != pSVar3) {
      iVar11 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].spliceidx;
      if (iVar11 < (int)(((long)pSVar3 - (long)pSVar10) / 0x18)) {
        std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
                  ((vector<re2::Frame,std::allocator<re2::Frame>> *)&stk,&pSVar10[iVar11].sub,
                   &pSVar10[iVar11].nsub);
        goto LAB_001b8198;
      }
      uVar9 = 0;
      uVar12 = 0;
      while( true ) {
        if (pFVar5[-1].nsub <= (int)uVar12) break;
        uVar9 = (ulong)(int)uVar9;
        lVar6 = (long)(int)uVar12 << 3;
        lVar13 = uVar9 << 0x20;
        while( true ) {
          ppRVar4 = pFVar5[-1].sub;
          iVar11 = (int)uVar12;
          if (pSVar10->sub <= (Regexp **)((long)ppRVar4 + lVar6)) break;
          ppRVar4[uVar9] = *(Regexp **)((long)ppRVar4 + lVar6);
          uVar9 = uVar9 + 1;
          uVar12 = (ulong)(iVar11 + 1);
          lVar6 = lVar6 + 8;
          lVar13 = lVar13 + 0x100000000;
        }
        if (pFVar5[-1].round - 1U < 2) {
          re[0] = pSVar10->prefix;
          re[1] = AlternateNoFactor(pSVar10->sub,pSVar10->nsuffix,flags);
          pRVar7 = Concat(re,2,flags);
          uVar9 = (ulong)((int)uVar9 + 1);
          *(Regexp **)((long)pFVar5[-1].sub + (lVar13 >> 0x1d)) = pRVar7;
          uVar12 = (ulong)(uint)(iVar11 + pSVar10->nsub);
        }
        else if (pFVar5[-1].round == 3) {
          uVar9 = (ulong)((int)uVar9 + 1);
          *(Regexp **)((long)ppRVar4 + (lVar13 >> 0x1d)) = pSVar10->prefix;
          uVar12 = (ulong)(uint)(iVar11 + pSVar10->nsub);
        }
        else {
          LogMessage::LogMessage
                    ((LogMessage *)re,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                     ,0x3d0);
          poVar8 = std::operator<<((ostream *)(re + 1),"unknown round: ");
          std::ostream::operator<<(poVar8,pFVar5[-1].round);
          LogMessage::~LogMessage((LogMessage *)re);
        }
        pSVar10 = pSVar10 + 1;
        if (pSVar10 ==
            pFVar5[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          iVar11 = pFVar5[-1].nsub;
          uVar9 = (ulong)(int)uVar9;
          for (uVar12 = (ulong)(int)uVar12; (long)uVar12 < (long)iVar11; uVar12 = uVar12 + 1) {
            pFVar5[-1].sub[uVar9] = pFVar5[-1].sub[uVar12];
            uVar9 = uVar9 + 1;
          }
        }
      }
      pSVar10 = pFVar5[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pFVar5[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar10) {
        pFVar5[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar10;
      }
      pFVar5[-1].nsub = (int)uVar9;
    }
    uVar1 = pFVar5[-1].round;
    pFVar5[-1].round = uVar1 + 1;
    if (3 < uVar1) {
      LogMessage::LogMessage
                ((LogMessage *)re,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                 ,0x3f7);
      poVar8 = std::operator<<((ostream *)(re + 1),"unknown round: ");
      std::ostream::operator<<(poVar8,pFVar5[-1].round);
      LogMessage::~LogMessage((LogMessage *)re);
      goto LAB_001b840b;
    }
    splices = &pFVar5[-1].splices;
    switch(uVar1) {
    case 0:
      FactorAlternationImpl::Round1(pFVar5[-1].sub,pFVar5[-1].nsub,0x2fc128,splices);
      break;
    case 1:
      FactorAlternationImpl::Round2(pFVar5[-1].sub,pFVar5[-1].nsub,0x2fc128,splices);
      break;
    case 2:
      FactorAlternationImpl::Round3(pFVar5[-1].sub,pFVar5[-1].nsub,flags,splices);
      break;
    case 3:
      goto switchD_001b834a_caseD_3;
    }
LAB_001b840b:
    pSVar10 = pFVar5[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar3 = pFVar5[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pSVar10 == pSVar3) || (iVar11 = 0, pFVar5[-1].round == 3)) {
      iVar11 = (int)(((long)pSVar3 - (long)pSVar10) / 0x18);
    }
    pFVar5[-1].spliceidx = iVar11;
  } while( true );
switchD_001b834a_caseD_3:
  iVar11 = pFVar5[-1].nsub;
  if ((long)stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_start == 0x30) {
    std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector(&stk);
    return iVar11;
  }
  pFVar5 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  std::_Vector_base<re2::Splice,_std::allocator<re2::Splice>_>::~_Vector_base
            (&(pFVar5->splices).super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>);
  iVar2 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].spliceidx;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
  super__Vector_impl_data._M_start[iVar2].nsuffix = iVar11;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1].spliceidx = iVar2 + 1;
  goto LAB_001b8198;
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}